

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

void llvm::function_ref<void(llvm::Error)>::callback_fn<void(llvm::Error)>
               (intptr_t callable,Error *params)

{
  Error local_20;
  Error *local_18;
  Error *params_local;
  intptr_t callable_local;
  
  local_18 = params;
  params_local = (Error *)callable;
  Error::Error(&local_20,params);
  (*(code *)callable)(&local_20);
  Error::~Error(&local_20);
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params ...params) {
    return (*reinterpret_cast<Callable*>(callable))(
        std::forward<Params>(params)...);
  }